

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O3

void __thiscall Rml::Context::PushDocumentToBack(Context *this,ElementDocument *document)

{
  long lVar1;
  Element *pEVar2;
  int iVar3;
  ElementDocument *pEVar4;
  long lVar5;
  long lVar6;
  __uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_> local_30;
  
  pEVar4 = (ElementDocument *)
           Element::GetFirstChild
                     ((this->root)._M_t.
                      super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                      super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                      super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl);
  if (pEVar4 != document) {
    iVar3 = Element::GetNumChildren
                      ((this->root)._M_t.
                       super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                       super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                       super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,false);
    if (0 < iVar3) {
      lVar6 = 0;
      lVar5 = 0;
      do {
        pEVar4 = (ElementDocument *)
                 Element::GetChild((this->root)._M_t.
                                   super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>
                                   .super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,
                                   (int)lVar5);
        if (pEVar4 == document) {
          lVar1 = *(long *)&(((this->root)._M_t.
                              super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t
                              .super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                              super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl)->children).
                            super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                            ._M_impl;
          local_30._M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
          super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl =
               *(tuple<Rml::Element_*,_Rml::Releaser<Rml::Element>_> *)
                &((_Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_> *)
                 (lVar1 + lVar5 * 8))->super__Head_base<0UL,_Rml::Element_*,_false>;
          *(undefined8 *)(lVar1 + lVar5 * 8) = 0;
          pEVar2 = (this->root)._M_t.
                   super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                   super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                   super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
          ::std::
          vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
          ::_M_erase(&pEVar2->children,
                     (unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)
                     (*(long *)&(pEVar2->children).
                                super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                                ._M_impl + lVar6));
          pEVar2 = (this->root)._M_t.
                   super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                   super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                   super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
          ::std::
          vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
          ::_M_insert_rval(&pEVar2->children,
                           *(unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> **)
                            &(pEVar2->children).
                             super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                             ._M_impl,(value_type *)&local_30);
          Element::DirtyStackingContext
                    ((this->root)._M_t.
                     super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                     super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                     super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl);
          if (local_30._M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
              super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl !=
              (_Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>)0x0) {
            (**(code **)(*(long *)local_30._M_t.
                                  super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>
                                  .super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl + 0x10)
            )();
          }
        }
        lVar5 = lVar5 + 1;
        iVar3 = Element::GetNumChildren
                          ((this->root)._M_t.
                           super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                           super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                           super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,false);
        lVar6 = lVar6 + 8;
      } while (lVar5 < iVar3);
    }
  }
  return;
}

Assistant:

void Context::PushDocumentToBack(ElementDocument* document)
{
	if (document != root->GetFirstChild())
	{
		// See PullDocumentToFront().
		for (int i = 0; i < root->GetNumChildren(); ++i)
		{
			if (root->GetChild(i) == document)
			{
				ElementPtr element = std::move(root->children[i]);
				root->children.erase(root->children.begin() + i);
				root->children.insert(root->children.begin(), std::move(element));

				root->DirtyStackingContext();
			}
		}
	}
}